

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

int process_single_source
              (string *file_name,string *source_code,string *sqconfig_file_name,bool use_csq,
              bool collect_ident_tree)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  bool bVar5;
  undefined1 uVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  Lexer *pLVar12;
  size_type sVar13;
  reference pvVar14;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  byte in_R8B;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar15;
  Node *in_stack_000000f8;
  Analyzer *in_stack_00000100;
  Analyzer analyzer;
  Node *root;
  bool res;
  Lexer lex;
  string sqconfigFileName;
  Lexer *in_stack_000002c0;
  ifstream tmp;
  char *in_stack_00000408;
  int in_stack_00000410;
  int in_stack_00000414;
  CompilationContext *in_stack_00000418;
  bool expectError;
  int expectWarningNumber;
  bool used;
  char *arg;
  int i;
  char *astFileName;
  char *tokensFileName;
  bool printAstToJson;
  bool printTokensToJson;
  bool printAst;
  bool inverseWarnings;
  CompilationContext ctx;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  CompilationContext *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  string *in_stack_fffffffffffff948;
  allocator *paVar16;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  Lexer *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff964;
  undefined1 uVar17;
  undefined1 in_stack_fffffffffffff965;
  undefined1 uVar18;
  undefined1 in_stack_fffffffffffff966;
  undefined1 in_stack_fffffffffffff967;
  uint in_stack_fffffffffffff96c;
  streambuf_type *psVar19;
  undefined8 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  byte bVar20;
  undefined1 in_stack_fffffffffffff97d;
  undefined1 in_stack_fffffffffffff97f;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  CompilationContext *in_stack_fffffffffffff990;
  allocator local_651;
  Lexer *in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9bc;
  CompilationContext *in_stack_fffffffffffff9c0;
  CompilationContext *in_stack_fffffffffffff9c8;
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [12];
  string local_5d0 [88];
  char *in_stack_fffffffffffffa88;
  IdentTree *in_stack_fffffffffffffb10;
  Node *in_stack_fffffffffffffb18;
  bool local_4c9;
  undefined1 in_stack_fffffffffffffb63;
  undefined1 in_stack_fffffffffffffb64;
  undefined1 in_stack_fffffffffffffb65;
  undefined1 in_stack_fffffffffffffb66;
  undefined1 in_stack_fffffffffffffb67;
  int in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  Node *in_stack_fffffffffffffb70;
  Analyzer *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffba0;
  streambuf_type local_439 [33];
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  string local_3d0 [8];
  Node *in_stack_fffffffffffffc38;
  Analyzer *in_stack_fffffffffffffc40;
  string local_3b0 [32];
  undefined1 local_390 [104];
  char *in_stack_fffffffffffffcd8;
  int local_17c;
  char *local_150;
  int local_144;
  string local_88 [32];
  vector<int,_std::allocator<int>_> avStack_68 [2];
  byte local_34;
  byte local_33;
  OutputMode local_30;
  byte local_22;
  byte local_21;
  string *local_20;
  string *local_18;
  undefined8 local_10;
  uint local_4;
  
  local_21 = in_CL & 1;
  local_22 = in_R8B & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  CompilationContext::CompilationContext
            ((CompilationContext *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  if ((local_22 & 1) != 0) {
    local_21 = 0;
  }
  bVar5 = false;
  bVar7 = false;
  bVar2 = false;
  for (local_144 = 1; local_144 < argc__; local_144 = local_144 + 1) {
    local_150 = argv__[local_144];
    bVar1 = true;
    iVar8 = strcmp("-duplucate-if-expression",local_150);
    if (iVar8 == 0) {
      local_150 = "-duplicate-if-expression";
    }
    iVar8 = strncmp(local_150,"--tokens-output-file:",0x15);
    if (iVar8 == 0) {
      bVar7 = true;
    }
    else {
      iVar8 = strncmp(local_150,"--ast-output-file:",0x12);
      if (iVar8 == 0) {
        bVar2 = true;
      }
      else {
        iVar8 = strcmp(local_150,"--inverse-warnings");
        if (iVar8 == 0) {
          bVar5 = true;
        }
        else {
          iVar8 = strncmp(local_150,"--csq-exe:",10);
          if (iVar8 == 0) {
            std::__cxx11::string::operator=
                      ((string *)moduleexports::csq_exe_abi_cxx11_,local_150 + 10);
          }
          else {
            iVar8 = strncmp(local_150,"--output-mode:",0xe);
            if (iVar8 == 0) {
              local_30 = str_to_output_mode((char *)CONCAT44(in_stack_fffffffffffff91c,
                                                             in_stack_fffffffffffff918));
            }
            else if (((*local_150 == '-') && (iVar8 = toupper((int)local_150[1]), iVar8 == 0x57)) &&
                    (iVar8 = isdigit((int)local_150[2]), iVar8 != 0)) {
              atoi(local_150 + 2);
              CompilationContext::suppressWaring
                        (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
            }
            else if ((*local_150 == '-') && (iVar8 = isalpha((int)local_150[1]), iVar8 != 0)) {
              CompilationContext::suppressWaring
                        (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            }
            else {
              bVar1 = false;
            }
          }
        }
      }
    }
    if (bVar1) {
      pVar15 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                          (value_type *)in_stack_fffffffffffff938);
      in_stack_fffffffffffff980 = pVar15.first._M_node;
      in_stack_fffffffffffff97f = pVar15.second;
    }
  }
  if (bVar5) {
    CompilationContext::inverseWarningsSuppression
              ((CompilationContext *)
               CONCAT17(in_stack_fffffffffffff967,
                        CONCAT16(in_stack_fffffffffffff966,
                                 CONCAT15(in_stack_fffffffffffff965,
                                          CONCAT14(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960)))));
  }
  uVar3 = CompilationContext::isWarningSuppressed
                    ((CompilationContext *)
                     CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950),
                     (char *)in_stack_fffffffffffff948);
  if ((bool)uVar3) {
    in_stack_fffffffffffff97d =
         CompilationContext::isWarningSuppressed
                   ((CompilationContext *)
                    CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950),
                    (char *)in_stack_fffffffffffff948);
    bVar20 = 0;
    if (!(bool)in_stack_fffffffffffff97d) goto LAB_00132799;
  }
  else {
LAB_00132799:
    bVar20 = local_21;
  }
  variable_presense_check = (bool)(bVar20 & 1);
  local_17c = 0;
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) != 0) {
    CompilationContext::globalError((char *)in_stack_fffffffffffff980._M_node);
    local_4 = 1;
    goto LAB_001333c1;
  }
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    std::__cxx11::string::operator=(local_88,local_18);
    psVar19 = (streambuf_type *)((ulong)in_stack_fffffffffffff96c << 0x20);
  }
  else {
    std::ifstream::ifstream(local_390,local_10,8);
    bVar4 = std::ios::fail();
    in_stack_fffffffffffff978 = CONCAT13(bVar4,(int3)in_stack_fffffffffffff978);
    bVar5 = (bVar4 & 1) != 0;
    if (bVar5) {
      paVar16 = &local_3f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,"Cannot open file \'",paVar16);
      std::__cxx11::string::c_str();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      std::__cxx11::string::c_str();
      CompilationContext::globalError((char *)in_stack_fffffffffffff980._M_node);
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      psVar19 = (streambuf_type *)((ulong)in_stack_fffffffffffff96c << 0x20);
      local_4 = 1;
    }
    else {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (istream_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      psVar19 = local_439;
      std::allocator<char>::allocator();
      __beg._M_sbuf._4_1_ = bVar20;
      __beg._M_sbuf._0_4_ = in_stack_fffffffffffff978;
      __beg._M_sbuf._5_1_ = in_stack_fffffffffffff97d;
      __beg._M_sbuf._6_1_ = uVar3;
      __beg._M_sbuf._7_1_ = in_stack_fffffffffffff97f;
      __beg._8_8_ = in_stack_fffffffffffff980._M_node;
      __end._8_8_ = in_stack_fffffffffffff970;
      __end._M_sbuf = psVar19;
      std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff967,
                          CONCAT16(in_stack_fffffffffffff966,
                                   CONCAT15(in_stack_fffffffffffff965,
                                            CONCAT14(in_stack_fffffffffffff964,
                                                     in_stack_fffffffffffff960)))),__beg,__end,
                 (allocator<char> *)in_stack_fffffffffffff958);
      std::__cxx11::string::operator=(local_88,local_418);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)local_439);
    }
    std::ifstream::~ifstream(local_390);
    if (bVar5) goto LAB_001333c1;
  }
  CompilationContext::setFileName
            ((CompilationContext *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950),
             in_stack_fffffffffffff948);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    std::__cxx11::string::string((string *)&stack0xfffffffffffffba0,local_20);
  }
  else {
    std::__cxx11::string::c_str();
    settings::search_sqconfig_abi_cxx11_(in_stack_fffffffffffffa88);
  }
  bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
  if (bVar5) {
    settings::reset();
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff967 = settings::append_from_file(in_stack_fffffffffffffcd8);
      if (!(bool)in_stack_fffffffffffff967) {
        local_4 = 1;
        goto LAB_001333a3;
      }
    }
LAB_00132c0a:
    if ((variable_presense_check & 1U) != 0) {
      moduleexports::module_export_collector
                (in_stack_00000418,in_stack_00000414,in_stack_00000410,in_stack_00000408);
    }
    pcVar10 = (char *)std::__cxx11::string::c_str();
    iVar8 = strncmp(pcVar10,"//expect:error",0xe);
    bVar5 = iVar8 == 0;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    iVar8 = strncmp(pcVar10,"//expect:w",10);
    if (iVar8 == 0) {
      lVar11 = std::__cxx11::string::c_str();
      local_17c = atoi((char *)(lVar11 + 10));
    }
    if ((bVar5) || (local_17c != 0)) {
      CompilationContext::clearSuppressedWarnings((CompilationContext *)0x132cd8);
    }
    if (((bVar7) || (bVar2)) && (CompilationContext::redirectMessagesToJson == (char *)0x0)) {
      CompilationContext::clearSuppressedWarnings((CompilationContext *)0x132d0a);
      CompilationContext::inverseWarningsSuppression
                ((CompilationContext *)
                 CONCAT17(in_stack_fffffffffffff967,
                          CONCAT16(in_stack_fffffffffffff966,
                                   CONCAT15(in_stack_fffffffffffff965,
                                            CONCAT14(in_stack_fffffffffffff964,
                                                     in_stack_fffffffffffff960)))));
    }
    uVar6 = process_import(in_stack_fffffffffffff9c8);
    if ((bool)uVar6) {
      Lexer::Lexer((Lexer *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   in_stack_fffffffffffff938);
      local_4c9 = Lexer::process(in_stack_000002c0);
      uVar17 = local_4c9;
      uVar18 = local_4c9;
      if (bVar7) {
        bVar7 = tokens_to_json((char *)in_stack_fffffffffffff958,
                               (Lexer *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950
                                                ));
        in_stack_fffffffffffff960 = CONCAT13(bVar7,(int3)in_stack_fffffffffffff960);
        local_4c9 = local_4c9 && bVar7;
      }
      if (local_4c9 == false) {
LAB_00133028:
        if (((local_34 & 1) != 0) || ((local_33 & 1) != 0)) {
          local_4c9 = false;
        }
        if ((bVar5) && ((local_34 & 1) == 0)) {
          CompilationContext::globalError((char *)in_stack_fffffffffffff980._M_node);
          local_4 = 1;
        }
        else if ((local_17c == 0) ||
                ((((local_33 & 1) != 0 &&
                  (sVar13 = std::vector<int,_std::allocator<int>_>::size(avStack_68), sVar13 == 1))
                 && (pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](avStack_68,0),
                    *pvVar14 == local_17c)))) {
          if ((bVar5) || (local_17c != 0)) {
            iVar8 = CompilationContext::getErrorLevel();
            if (iVar8 != 4) {
              CompilationContext::clearErrorLevel();
            }
            local_4 = 0;
          }
          else {
            local_4 = (uint)(local_4c9 == false);
          }
        }
        else {
          paVar16 = &local_651;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffff9b0,"Expected only one warning \'w",paVar16);
          std::__cxx11::to_string((int)((ulong)psVar19 >> 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff958,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          std::__cxx11::string::c_str();
          CompilationContext::globalError((char *)in_stack_fffffffffffff980._M_node);
          std::__cxx11::string::~string(local_5d0);
          std::__cxx11::string::~string(local_5f0);
          std::__cxx11::string::~string(local_610);
          std::__cxx11::string::~string(local_630);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffff988);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffff9b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_651);
          local_4 = 1;
        }
      }
      else {
        pLVar12 = (Lexer *)sq3_parse((Lexer *)in_stack_fffffffffffff9c0);
        in_stack_fffffffffffff958 = pLVar12;
        if (bVar2) {
          in_stack_fffffffffffff957 =
               ast_to_json((char *)in_stack_fffffffffffff980._M_node,
                           (Node *)CONCAT17(in_stack_fffffffffffff97f,
                                            CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff97d,
                                                                    CONCAT14(bVar20,
                                                  in_stack_fffffffffffff978)))));
          local_4c9 = ((local_4c9 & in_stack_fffffffffffff957) != 0U & (local_34 ^ 0xff) & 1) != 0;
        }
        if ((local_34 & 1) != 0) goto LAB_00133028;
        if ((local_22 & 1) == 0) {
          Analyzer::Analyzer((Analyzer *)
                             CONCAT17(in_stack_fffffffffffff967,
                                      CONCAT16(uVar6,CONCAT15(uVar18,CONCAT14(uVar17,
                                                  in_stack_fffffffffffff960)))),
                             in_stack_fffffffffffff958);
          if (pLVar12 != (Lexer *)0x0) {
            collect_ever_declared(in_stack_fffffffffffff9b0);
            Analyzer::collectGlobalTables(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
            Analyzer::check(in_stack_00000100,in_stack_000000f8);
            in_stack_fffffffffffff930 = 0;
            in_stack_fffffffffffff928 = 1;
            in_stack_fffffffffffff920 = 0;
            Analyzer::checkVariables
                      (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c
                       ,in_stack_fffffffffffffb68,(bool)in_stack_fffffffffffffb67,
                       (bool)in_stack_fffffffffffffb66,(bool)in_stack_fffffffffffffb65,
                       (bool)in_stack_fffffffffffffb64,in_stack_fffffffffffffba0,
                       (bool)in_stack_fffffffffffffb63);
          }
          Analyzer::~Analyzer((Analyzer *)
                              CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          goto LAB_00133028;
        }
        if (pLVar12 == (Lexer *)0x0) goto LAB_00133028;
        collect_ever_declared(in_stack_fffffffffffff9b0);
        global_collect_tree(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
        local_4 = 0;
      }
      Lexer::~Lexer((Lexer *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    }
    else {
      local_4 = 1;
    }
  }
  else {
    if ((settings::cur_config_file_failed & 1) == 0) goto LAB_00132c0a;
    local_4 = 1;
  }
LAB_001333a3:
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffba0);
LAB_001333c1:
  CompilationContext::~CompilationContext
            ((CompilationContext *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
  return local_4;
}

Assistant:

int process_single_source(const string & file_name, const string & source_code, const string & sqconfig_file_name,
  bool use_csq, bool collect_ident_tree)
{
  CompilationContext ctx;

  if (collect_ident_tree)
    use_csq = false;

  bool inverseWarnings = false;
  bool printAst = false;

  bool printTokensToJson = false;
  bool printAstToJson = false;
  const char * tokensFileName = "";
  const char * astFileName = "";

  for (int i = 1; i < argc__; i++)
  {
    const char * arg = argv__[i];
    bool used = true;

    {
      // HACK: fix "duplucate-if-expression" -> "duplicate-if-expression", and support old config files
      if (!strcmp("-duplucate-if-expression", arg))
        arg = "-duplicate-if-expression";
    }

    if (!strncmp(arg, "--tokens-output-file:", 21))
    {
      printTokensToJson = true;
      tokensFileName = arg + 21;
    }
    else if (!strncmp(arg, "--ast-output-file:", 18))
    {
      printAstToJson = true;
      astFileName = arg + 18;
    }
    else if (!strcmp(arg, "--inverse-warnings"))
      inverseWarnings = true;
    else if (!strncmp(arg, "--csq-exe:", 10))
      moduleexports::csq_exe = arg + 10;
//    else if (!strcmp(arg, "--print-ast"))  // deprecated
//      printAst = true;
    else if (!strncmp(arg, "--output-mode:", 14))
      ctx.outputMode = str_to_output_mode(arg + 14);
    else if (arg[0] == '-' && (toupper(arg[1]) == 'W') && isdigit(arg[2]))
      ctx.suppressWaring(atoi(arg + 2));
    else if (arg[0] == '-' && isalpha(arg[1]))
      ctx.suppressWaring(arg + 1);
    else
      used = false;

    if (used)
      used_args.insert(i);
  }

  if (inverseWarnings)
    ctx.inverseWarningsSuppression();

  variable_presense_check = (!ctx.isWarningSuppressed("undefined-variable") ||
    !ctx.isWarningSuppressed("never-declared")) && use_csq;

  int expectWarningNumber = 0;
  bool expectError = false;


  if (file_name.empty())
  {
    CompilationContext::globalError("Expected file name");
    return 1;
  }

  if (source_code.empty())
  {
    ifstream tmp(file_name);
    if (tmp.fail())
    {
      CompilationContext::globalError((string("Cannot open file '") + file_name.c_str() + "'").c_str());
      return 1;
    }
    ctx.code = string((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  }
  else
  {
    ctx.code = source_code;
  }

  ctx.setFileName(file_name);


  string sqconfigFileName = sqconfig_file_name.empty() ? settings::search_sqconfig(file_name.c_str()) : sqconfig_file_name;
  if (sqconfigFileName != settings::cur_config_file_name)
  {
    settings::reset();
    if (!sqconfigFileName.empty())
      if (!settings::append_from_file(sqconfigFileName.c_str()))
        return 1;
  }
  else if (settings::cur_config_file_failed)
  {
    return 1;
  }


  if (variable_presense_check)
    moduleexports::module_export_collector(ctx, 0, 0, nullptr);


  if (!strncmp(ctx.code.c_str(), "//expect:error", sizeof("//expect:error") - 1))
    expectError = true;

  if (!strncmp(ctx.code.c_str(), "//expect:w", sizeof("//expect:w") - 1))
    expectWarningNumber = atoi(ctx.code.c_str() + sizeof("//expect:w") - 1);

  if (expectError || expectWarningNumber)
    ctx.clearSuppressedWarnings();

  if ((printTokensToJson || printAstToJson) && !CompilationContext::redirectMessagesToJson)
  {
    ctx.clearSuppressedWarnings();
    ctx.inverseWarningsSuppression();
  }

  if (!process_import(ctx))
    return 1;

  Lexer lex(ctx);

  bool res = true;
  res = res && lex.process();

  if (printTokensToJson)
    res &= tokens_to_json(tokensFileName, lex);


  if (res)
  {
    Node * root = sq3_parse(lex); // do not delete, will be destroyed in ~CompilationContext()

    if (printAstToJson)
    {
      res &= ast_to_json(astFileName, root);
      res &= !ctx.isError;
    }

    if (root && printAst)
      root->print();


    if (!ctx.isError)
    {
      if (collect_ident_tree)
      {
        if (root)
        {
          collect_ever_declared(lex);
          global_collect_tree(root, &ident_root);
          return 0;
        }
      }
      else
      {
        Analyzer analyzer(lex);

        if (root)
        {
          collect_ever_declared(lex);
          analyzer.collectGlobalTables(root);
          analyzer.check(root);
          analyzer.checkVariables(root, 0, INT_MAX / 2, false, false, false, false, 1, false);
        }
      }
    }
  }

  if (ctx.isError || ctx.isWarning)
    res = false;

  if (expectError && !ctx.isError)
  {
    CompilationContext::globalError("Expected error.");
    return 1;
  }

  if (expectWarningNumber && (!ctx.isWarning || ctx.shownWarningsAndErrors.size() != 1 ||
    ctx.shownWarningsAndErrors[0] != expectWarningNumber))
  {
    CompilationContext::globalError((string("Expected only one warning 'w") +
      to_string(expectWarningNumber) + "' in file '" + ctx.fileName + "'").c_str());
    return 1;
  }

  if (expectError || expectWarningNumber)
  {
    if (CompilationContext::getErrorLevel() != ERRORLEVEL_FATAL)
      CompilationContext::clearErrorLevel();

    return 0;
  }

  return res ? 0 : 1;
}